

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  FILE *__stream;
  int iVar6;
  regex_t re;
  regmatch_t subs [10];
  char erbuf [100];
  regex_t arStack_158 [3];
  char local_98 [112];
  
  progname = *argv;
  iVar6 = 0;
LAB_0010352b:
  while (iVar2 = getopt(argc,argv,"c:e:S:E:x"), 0x62 < iVar2) {
    if (iVar2 == 0x78) {
      debug = debug + 1;
    }
    else if (iVar2 == 0x65) {
      eopts = options(0x65,_optarg);
    }
    else if (iVar2 == 99) {
      copts = options(99,_optarg);
    }
    else {
LAB_001035ba:
      iVar6 = iVar6 + 1;
    }
  }
  if (iVar2 == 0x45) {
    iVar2 = atoi(_optarg);
    endoff = (regoff_t)iVar2;
    goto LAB_0010352b;
  }
  if (iVar2 == 0x53) {
    iVar2 = atoi(_optarg);
    startoff = (regoff_t)iVar2;
    goto LAB_0010352b;
  }
  if (iVar2 != -1) goto LAB_001035ba;
  if (iVar6 != 0) {
    fprintf(_stderr,"usage: %s ",progname);
    fwrite("[-c copt][-C][-d] [re]\n",0x17,1,_stderr);
    exit(2);
  }
  lVar3 = (long)_optind;
  if (argc <= _optind) {
    regress(_stdin);
    goto LAB_00103767;
  }
  _optind = _optind + 1;
  iVar6 = regcomp(arStack_158,argv[lVar3],copts);
  if (iVar6 == 0) {
    regprint((regex_t *)arStack_158,_stdout);
    iVar6 = eopts;
    lVar3 = (long)_optind;
    if (argc <= _optind) {
      regfree(arStack_158);
      goto LAB_00103767;
    }
    if ((eopts & 4U) != 0) {
      arStack_158[0].fastmap = (char *)startoff;
      sVar4 = strlen(argv[lVar3]);
      arStack_158[0].translate = (uchar *)(sVar4 - endoff);
    }
    iVar6 = regexec(arStack_158,argv[lVar3],10,(regmatch_t *)&arStack_158[0].fastmap,iVar6);
    if (iVar6 == 0) {
      if ((copts & 4U) == 0) {
        if (arStack_158[0].fastmap != (char *)0xffffffffffffffff) {
          if ((int)arStack_158[0].translate == (int)arStack_158[0].fastmap) {
            printf("match `\'@%.1s\n",argv[_optind] + (long)arStack_158[0].fastmap);
          }
          else {
            printf("match `%.*s\'\n");
          }
        }
        uVar5 = 1;
        lVar3 = 0x18;
        do {
          lVar1 = *(long *)((long)&arStack_158[0].syntax + lVar3);
          if (lVar1 != -1) {
            printf("(%d) `%.*s\'\n",uVar5,
                   (ulong)(uint)(*(int *)((long)&arStack_158[0].fastmap + lVar3) - (int)lVar1),
                   argv[_optind] + lVar1);
          }
          uVar5 = (ulong)((int)uVar5 + 1);
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0xa8);
      }
      goto LAB_00103767;
    }
    uVar5 = regerror(iVar6,arStack_158,local_98,100);
    __stream = _stderr;
    eprint(iVar6);
  }
  else {
    uVar5 = regerror(iVar6,arStack_158,local_98,100);
    __stream = _stderr;
    eprint(iVar6);
  }
  fprintf(__stream,"error %s, %d/%d `%s\'\n",eprint::epbuf,uVar5 & 0xffffffff,100,local_98);
LAB_00103767:
  exit(status);
}

Assistant:

int main(argc, argv)
int argc;
char *argv[];
{
	regex_t re;
#	define	NS	10
	regmatch_t subs[NS];
	char erbuf[100];
	int err;
	size_t len;
	int c;
	int errflg = 0;
	register int i;
	extern int optind;
	extern char *optarg;

	progname = argv[0];

	while ((c = getopt(argc, argv, "c:e:S:E:x")) != EOF)
		switch (c) {
		case 'c':	/* compile options */
			copts = options('c', optarg);
			break;
		case 'e':	/* execute options */
			eopts = options('e', optarg);
			break;
		case 'S':	/* start offset */
			startoff = (regoff_t)atoi(optarg);
			break;
		case 'E':	/* end offset */
			endoff = (regoff_t)atoi(optarg);
			break;
		case 'x':	/* Debugging. */
			debug++;
			break;
		case '?':
		default:
			errflg++;
			break;
		}
	if (errflg) {
		fprintf(stderr, "usage: %s ", progname);
		fprintf(stderr, "[-c copt][-C][-d] [re]\n");
		exit(2);
	}

	if (optind >= argc) {
		regress(stdin);
		exit(status);
	}

	err = regcomp(&re, argv[optind++], copts);
	if (err) {
		len = regerror(err, &re, erbuf, sizeof(erbuf));
		fprintf(stderr, "error %s, %d/%d `%s'\n",
			eprint(err), (int)len, (int)sizeof(erbuf), erbuf);
		exit(status);
	}
	regprint(&re, stdout);	

	if (optind >= argc) {
		regfree(&re);
		exit(status);
	}

	if (eopts&REG_STARTEND) {
		subs[0].rm_so = startoff;
		subs[0].rm_eo = strlen(argv[optind]) - endoff;
	}
	err = regexec(&re, argv[optind], (size_t)NS, subs, eopts);
	if (err) {
		len = regerror(err, &re, erbuf, sizeof(erbuf));
		fprintf(stderr, "error %s, %d/%d `%s'\n",
			eprint(err), (int)len, (int)sizeof(erbuf), erbuf);
		exit(status);
	}
	if (!(copts&REG_NOSUB)) {
		len = (int)(subs[0].rm_eo - subs[0].rm_so);
		if (subs[0].rm_so != -1) {
			if (len != 0)
				printf("match `%.*s'\n", (int)len,
					argv[optind] + subs[0].rm_so);
			else
				printf("match `'@%.1s\n",
					argv[optind] + subs[0].rm_so);
		}
		for (i = 1; i < NS; i++)
			if (subs[i].rm_so != -1)
				printf("(%d) `%.*s'\n", i,
					(int)(subs[i].rm_eo - subs[i].rm_so),
					argv[optind] + subs[i].rm_so);
	}
	exit(status);
}